

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

void uprv_parseCurrency_63
               (char *locale,UnicodeString *text,ParsePosition *pos,int8_t type,
               int32_t *partialMatchLen,UChar *result,UErrorCode *ec)

{
  int32_t total_currency_count;
  int32_t total_currency_count_00;
  CurrencyNameStruct *currencyNames_00;
  CurrencyNameStruct *currencyNames_01;
  UBool UVar1;
  int32_t start_00;
  int32_t iVar2;
  CurrencyNameCacheEntry *cacheEntry_00;
  int32_t local_23c;
  int32_t local_238;
  int32_t local_234;
  int32_t matchIndexInSymbol;
  int32_t maxInSymbol;
  int32_t matchIndex;
  int32_t max;
  UErrorCode ec1;
  Char16Ptr local_218;
  int32_t local_20c;
  UChar local_208 [2];
  int32_t textLen;
  UChar upperText [100];
  char16_t local_138 [4];
  UChar inputText [100];
  int32_t start;
  CurrencyNameStruct *currencySymbols;
  int32_t total_currency_symbol_count;
  CurrencyNameStruct *currencyNames;
  int32_t total_currency_name_count;
  CurrencyNameCacheEntry *cacheEntry;
  UChar *result_local;
  int32_t *partialMatchLen_local;
  int8_t type_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  char *locale_local;
  
  UVar1 = U_FAILURE(*ec);
  if (UVar1 == '\0') {
    cacheEntry_00 = getCacheEntry(locale,ec);
    UVar1 = U_FAILURE(*ec);
    if (UVar1 == '\0') {
      total_currency_count = cacheEntry_00->totalCurrencyNameCount;
      currencyNames_00 = cacheEntry_00->currencyNames;
      total_currency_count_00 = cacheEntry_00->totalCurrencySymbolCount;
      currencyNames_01 = cacheEntry_00->currencySymbols;
      start_00 = icu_63::ParsePosition::getIndex(pos);
      iVar2 = icu_63::UnicodeString::length(text);
      if (iVar2 - start_00 < 0x65) {
        iVar2 = icu_63::UnicodeString::length(text);
        local_23c = iVar2 - start_00;
      }
      else {
        local_23c = 100;
      }
      local_20c = local_23c;
      icu_63::Char16Ptr::Char16Ptr(&local_218,local_138);
      icu_63::UnicodeString::extract(text,start_00,local_23c,&local_218,0);
      icu_63::Char16Ptr::~Char16Ptr(&local_218);
      matchIndex = 0;
      local_20c = u_strToUpper_63(local_208,100,local_138,local_20c,locale,&matchIndex);
      *partialMatchLen = 0;
      maxInSymbol = 0;
      matchIndexInSymbol = -1;
      searchCurrencyName(currencyNames_00,total_currency_count,local_208,local_20c,partialMatchLen,
                         &maxInSymbol,&matchIndexInSymbol);
      local_234 = 0;
      local_238 = -1;
      if (type != '\x01') {
        searchCurrencyName(currencyNames_01,total_currency_count_00,local_138,local_20c,
                           partialMatchLen,&local_234,&local_238);
      }
      if ((maxInSymbol < local_234) || (matchIndexInSymbol == -1)) {
        if ((maxInSymbol <= local_234) && (local_238 != -1)) {
          u_charsToUChars_63(currencyNames_01[local_238].IsoCode,result,4);
          icu_63::ParsePosition::setIndex(pos,start_00 + local_234);
        }
      }
      else {
        u_charsToUChars_63(currencyNames_00[matchIndexInSymbol].IsoCode,result,4);
        icu_63::ParsePosition::setIndex(pos,start_00 + maxInSymbol);
      }
      releaseCacheEntry(cacheEntry_00);
    }
  }
  return;
}

Assistant:

U_CAPI void
uprv_parseCurrency(const char* locale,
                   const icu::UnicodeString& text,
                   icu::ParsePosition& pos,
                   int8_t type,
                   int32_t* partialMatchLen,
                   UChar* result,
                   UErrorCode& ec) {
    U_NAMESPACE_USE
    if (U_FAILURE(ec)) {
        return;
    }
    CurrencyNameCacheEntry* cacheEntry = getCacheEntry(locale, ec);
    if (U_FAILURE(ec)) {
        return;
    }

    int32_t total_currency_name_count = cacheEntry->totalCurrencyNameCount;
    CurrencyNameStruct* currencyNames = cacheEntry->currencyNames;
    int32_t total_currency_symbol_count = cacheEntry->totalCurrencySymbolCount;
    CurrencyNameStruct* currencySymbols = cacheEntry->currencySymbols;

    int32_t start = pos.getIndex();

    UChar inputText[MAX_CURRENCY_NAME_LEN];  
    UChar upperText[MAX_CURRENCY_NAME_LEN];  
    int32_t textLen = MIN(MAX_CURRENCY_NAME_LEN, text.length() - start);
    text.extract(start, textLen, inputText);
    UErrorCode ec1 = U_ZERO_ERROR;
    textLen = u_strToUpper(upperText, MAX_CURRENCY_NAME_LEN, inputText, textLen, locale, &ec1);

    // Make sure partialMatchLen is initialized
    *partialMatchLen = 0;

    int32_t max = 0;
    int32_t matchIndex = -1;
    // case in-sensitive comparision against currency names
    searchCurrencyName(currencyNames, total_currency_name_count, 
                       upperText, textLen, partialMatchLen, &max, &matchIndex);

#ifdef UCURR_DEBUG
    printf("search in names, max = %d, matchIndex = %d\n", max, matchIndex);
#endif

    int32_t maxInSymbol = 0;
    int32_t matchIndexInSymbol = -1;
    if (type != UCURR_LONG_NAME) {  // not name only
        // case sensitive comparison against currency symbols and ISO code.
        searchCurrencyName(currencySymbols, total_currency_symbol_count, 
                           inputText, textLen,
                           partialMatchLen,
                           &maxInSymbol, &matchIndexInSymbol);
    }

#ifdef UCURR_DEBUG
    printf("search in symbols, maxInSymbol = %d, matchIndexInSymbol = %d\n", maxInSymbol, matchIndexInSymbol);
    if(matchIndexInSymbol != -1) {
      printf("== ISO=%s\n", currencySymbols[matchIndexInSymbol].IsoCode);
    }
#endif

    if (max >= maxInSymbol && matchIndex != -1) {
        u_charsToUChars(currencyNames[matchIndex].IsoCode, result, 4);
        pos.setIndex(start + max);
    } else if (maxInSymbol >= max && matchIndexInSymbol != -1) {
        u_charsToUChars(currencySymbols[matchIndexInSymbol].IsoCode, result, 4);
        pos.setIndex(start + maxInSymbol);
    }

    // decrease reference count
    releaseCacheEntry(cacheEntry);
}